

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_insert_multiple_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  int local_ac;
  ion_dictionary_t dict;
  char key [9];
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_none);
  iVar2 = 100;
  for (uVar1 = 0x32; uVar1 != 0x37; uVar1 = uVar1 + 1) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_ac = iVar2;
    bhdct_insert(tc,&dict,key,&local_ac,'\0');
    iVar2 = iVar2 + 2;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_insert_multiple_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 50; i < 55; i++) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_insert(tc, &dict, key, IONIZE(i * 2, int), boolean_false);
	}

	bhdct_takedown(tc, &dict);
}